

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inline.cpp
# Opt level: O1

Instr * __thiscall
Inline::InlineCall(Inline *this,Instr *callInstr,FunctionJITTimeInfo *funcInfo,
                  FunctionJITTimeInfo *inlinerData,StackSym *symCallerThis,bool *pIsInlined,
                  uint callSiteId,uint recursiveInlineDepth,bool isCallInstanceFunction)

{
  Func *pFVar1;
  code *pcVar2;
  BuiltinFunction BVar3;
  bool bVar4;
  OpndKind OVar5;
  byte bVar6;
  ArgSlot AVar7;
  OpCode opcode;
  uint uVar8;
  uint uVar9;
  JITTimeFunctionBody *pJVar10;
  FunctionJITTimeInfo *pFVar11;
  Instr *pIVar12;
  undefined4 *puVar13;
  char16 *inlineeName;
  Instr *pIVar14;
  RegOpnd *pRVar15;
  IntConstOpnd *this_00;
  Instr *pIVar16;
  StackSym *pSVar17;
  SymOpnd *dstOpnd;
  Opnd *pOVar18;
  char *this_01;
  Instr **ppIVar19;
  uint uVar20;
  Instr *local_a0;
  Instr *argImplicitThisInstr;
  Instr *argSecond;
  Instr *dummyInstr;
  FunctionJITTimeInfo *inlineeData;
  Instr *local_78;
  Instr *returnInstr;
  Instr *local_68;
  Instr *local_60;
  uint local_54;
  Instr *pIStack_50;
  uint actualCount;
  Opnd *local_48;
  StackSym *local_40;
  Instr *local_38;
  
  pIStack_50 = callInstr->m_next;
  pFVar1 = callInstr->m_func;
  returnInstr = callInstr;
  local_60 = (Instr *)funcInfo;
  local_48 = (Opnd *)inlinerData;
  local_40 = symCallerThis;
  uVar8 = FunctionJITTimeInfo::GetLocalFunctionId(funcInfo);
  BVar3 = Js::JavascriptLibrary::GetBuiltInForFuncInfo(uVar8);
  local_38 = (Instr *)CONCAT71(local_38._1_7_,BVar3._value);
  *pIsInlined = false;
  pJVar10 = JITTimeWorkItem::GetJITFunctionBody(this->topFunc->m_workItem);
  uVar8 = JITTimeFunctionBody::GetSourceContextId(pJVar10);
  pFVar11 = JITTimeWorkItem::GetJITTimeInfo(this->topFunc->m_workItem);
  uVar9 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar11);
  bVar4 = Js::Phases::IsEnabled((Phases *)&DAT_015bbe90,InlineCallPhase,uVar8,uVar9);
  if (!bVar4) {
    pJVar10 = JITTimeWorkItem::GetJITFunctionBody(pFVar1->m_workItem);
    uVar8 = JITTimeFunctionBody::GetSourceContextId(pJVar10);
    inlineeData = (FunctionJITTimeInfo *)pFVar1;
    pFVar11 = JITTimeWorkItem::GetJITTimeInfo(pFVar1->m_workItem);
    uVar9 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar11);
    bVar4 = Js::Phases::IsEnabled((Phases *)&DAT_015bbe90,InlineCallPhase,uVar8,uVar9);
    if (bVar4) {
      return pIStack_50;
    }
    pJVar10 = JITTimeWorkItem::GetJITFunctionBody(this->topFunc->m_workItem);
    AVar7 = JITTimeFunctionBody::GetInParamsCount(pJVar10);
    pIVar16 = returnInstr;
    if (AVar7 == 0) {
      return pIStack_50;
    }
    pIVar14 = (Instr *)returnInstr->m_src2;
    pIVar12 = GetDefInstr((Opnd *)pIVar14);
    OVar5 = IR::Opnd::GetKind(pIVar12->m_src2);
    if (OVar5 != OpndKindSym) {
      return pIStack_50;
    }
    *pIsInlined = true;
    dummyInstr = (Instr *)0x0;
    local_78 = (Instr *)0x0;
    pJVar10 = JITTimeWorkItem::GetJITFunctionBody(this->topFunc->m_workItem);
    uVar8 = JITTimeFunctionBody::GetSourceContextId(pJVar10);
    pFVar11 = JITTimeWorkItem::GetJITTimeInfo(this->topFunc->m_workItem);
    uVar9 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar11);
    bVar4 = Js::Phases::IsEnabled((Phases *)&DAT_015bbe90,InlineCallTargetPhase,uVar8,uVar9);
    if ((!bVar4) &&
       (bVar4 = InlineCallTarget(this,pIVar16,(FunctionJITTimeInfo *)local_48,
                                 (FunctionJITTimeInfo **)&dummyInstr,(FunctionJITTimeInfo *)local_60
                                 ,local_40,&local_78,recursiveInlineDepth,isCallInstanceFunction),
       bVar4)) {
      if (local_78 != (Instr *)0x0) {
        return local_78;
      }
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar13 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                         ,0xcd0,"(returnInstr)","returnInstr");
      if (bVar4) {
        *puVar13 = 0;
        return local_78;
      }
LAB_00554fc6:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    uVar20 = (uint)local_38;
    local_40 = (StackSym *)(ulong)isCallInstanceFunction;
    inlineeName = Js::JavascriptLibrary::GetNameForBuiltIn(local_38._0_1_);
    local_38 = pIVar14;
    pFVar11 = JITTimeWorkItem::GetJITTimeInfo(this->topFunc->m_workItem);
    bVar4 = JITTimeWorkItem::IsLoopBody(pIVar16->m_func->topFunc->m_workItem);
    TraceInlining((FunctionJITTimeInfo *)local_48,inlineeName,(char16 *)0x0,0,pFVar11,0,
                  (FunctionJITTimeInfo *)0x0,callSiteId,bVar4,uVar20 & 0xff);
    local_54 = 0;
    this_01 = (char *)local_38;
    OVar5 = IR::Opnd::GetKind((Opnd *)local_38);
    pFVar11 = inlineeData;
    if (OVar5 != OpndKindSym) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar13 = 1;
      this_01 = 
      "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
      ;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                         ,0xcdb,"(linkOpnd->IsSymOpnd())","linkOpnd->IsSymOpnd()");
      if (!bVar4) goto LAB_00554fc6;
      *puVar13 = 0;
    }
    pIVar16 = returnInstr;
    local_a0 = (Instr *)0x0;
    argImplicitThisInstr = (Instr *)0x0;
    argSecond = (Instr *)0x0;
    GetArgInstrsForCallAndApply
              ((Inline *)this_01,returnInstr,&local_a0,&argImplicitThisInstr,&argSecond,&local_54);
    pSVar17 = local_40;
    ppIVar19 = &local_a0;
    if (isCallInstanceFunction) {
      ppIVar19 = &argImplicitThisInstr;
    }
    local_38 = *ppIVar19;
    if (local_38 == (Instr *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar13 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                         ,0xce5,"(functionInstr)","functionInstr");
      if (!bVar4) goto LAB_00554fc6;
      *puVar13 = 0;
    }
    local_48 = pIVar16->m_src2;
    OVar5 = IR::Opnd::GetKind(local_48);
    if (OVar5 != OpndKindSym) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar13 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x45,"(this->IsSymOpnd())","Bad call to AsSymOpnd()");
      if (!bVar4) goto LAB_00554fc6;
      *puVar13 = 0;
    }
    EmitFixedMethodOrFunctionObjectChecksForBuiltIns
              (this,pIVar16,pIVar16,(FunctionJITTimeInfo *)local_60,false,true,false,true);
    uVar8 = local_54;
    pIVar14 = InsertInlineeBuiltInStartEndTags(this,pIVar16,local_54,(Instr **)0x0);
    pIVar14->m_opcode = InlineNonTrackingBuiltInEnd;
    uVar20 = ~(uint)pSVar17 + uVar8;
    pIVar14 = IR::Instr::New(StartCall,(Func *)pFVar11);
    pRVar15 = IR::RegOpnd::New(TyVar,(Func *)pFVar11);
    IR::Instr::SetDst(pIVar14,&pRVar15->super_Opnd);
    this_00 = IR::IntConstOpnd::New((IntConstType)(ulong)uVar20,TyInt32,(Func *)pFVar11,false);
    local_68 = pIVar14;
    if (pIVar14->m_src1 != (Opnd *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar13 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                         ,0x16c,"(this->m_src1 == __null)","Trying to overwrite existing src.");
      if (!bVar4) goto LAB_00554fc6;
      *puVar13 = 0;
    }
    pFVar1 = local_68->m_func;
    if ((this_00->super_Opnd).isDeleted == true) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar13 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x14,"(!isDeleted)","Using deleted operand");
      if (!bVar4) goto LAB_00554fc6;
      *puVar13 = 0;
    }
    bVar6 = (this_00->super_Opnd).field_0xb;
    if ((bVar6 & 2) != 0) {
      this_00 = (IntConstOpnd *)IR::Opnd::Copy(&this_00->super_Opnd,pFVar1);
      bVar6 = (this_00->super_Opnd).field_0xb;
    }
    (this_00->super_Opnd).field_0xb = bVar6 | 2;
    local_68->m_src1 = &this_00->super_Opnd;
    IR::Instr::InsertBefore(pIVar16,local_68);
    IR::Instr::ReplaceSrc1(pIVar16,local_38->m_src1);
    IR::Instr::UnlinkSrc2(pIVar16);
    pIVar16->m_opcode = CallI;
    if (uVar20 == 0) {
      pIVar16 = (Instr *)0x0;
    }
    else {
      local_40 = (StackSym *)(ulong)uVar20;
      puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      do {
        local_60 = pIVar16;
        pIVar16 = GetDefInstr(local_48);
        local_48 = pIVar16->m_src2;
        OVar5 = IR::Opnd::GetKind(local_48);
        if (OVar5 != OpndKindSym) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar13 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                             ,0x45,"(this->IsSymOpnd())","Bad call to AsSymOpnd()");
          if (!bVar4) goto LAB_00554fc6;
          *puVar13 = 0;
        }
        pOVar18 = pIVar16->m_src1;
        pSVar17 = IR::Opnd::GetStackSym(pOVar18);
        pIVar14 = local_38;
        pSVar17 = StackSym::New(pSVar17->m_type,local_38->m_func);
        pRVar15 = IR::RegOpnd::New(pSVar17,pOVar18->m_type,pIVar14->m_func);
        opcode = Func::GetLoadOpForType(pOVar18->m_type);
        pIVar14 = IR::Instr::New(opcode,&pRVar15->super_Opnd,pOVar18,pIVar14->m_func);
        IR::Instr::SetByteCodeOffset(pIVar14,pIVar16);
        IR::Opnd::SetIsJITOptimizedReg(&pRVar15->super_Opnd,true);
        IR::Instr::InsertBefore(pIVar16,pIVar14);
        pSVar17 = SymTable::GetArgSlotSym(returnInstr->m_func->m_symTable,(ArgSlot)local_40);
        pFVar11 = inlineeData;
        dstOpnd = IR::SymOpnd::New(&pSVar17->super_Sym,0,TyVar,(Func *)inlineeData);
        pIVar16 = IR::Instr::New(ArgOut_A,&dstOpnd->super_Opnd,&pRVar15->super_Opnd,(Func *)pFVar11)
        ;
        pIVar14 = local_60;
        if (local_60->m_src2 != (Opnd *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar13 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                             ,0x18b,"(this->m_src2 == __null)","Trying to overwrite existing src.");
          if (!bVar4) goto LAB_00554fc6;
          *puVar13 = 0;
        }
        pFVar1 = pIVar14->m_func;
        if ((dstOpnd->super_Opnd).isDeleted == true) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar13 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                             ,0x14,"(!isDeleted)","Using deleted operand");
          if (!bVar4) goto LAB_00554fc6;
          *puVar13 = 0;
        }
        bVar6 = (dstOpnd->super_Opnd).field_0xb;
        if ((bVar6 & 2) != 0) {
          dstOpnd = (SymOpnd *)IR::Opnd::Copy(&dstOpnd->super_Opnd,pFVar1);
          bVar6 = (dstOpnd->super_Opnd).field_0xb;
        }
        (dstOpnd->super_Opnd).field_0xb = bVar6 | 2;
        pIVar14->m_src2 = &dstOpnd->super_Opnd;
        IR::Instr::InsertBefore(pIVar14,pIVar16);
        uVar20 = (int)local_40 - 1;
        local_40 = (StackSym *)(ulong)uVar20;
      } while (uVar20 != 0);
    }
    pOVar18 = local_68->m_dst;
    if (pIVar16->m_src2 != (Opnd *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar13 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                         ,0x18b,"(this->m_src2 == __null)","Trying to overwrite existing src.");
      if (!bVar4) goto LAB_00554fc6;
      *puVar13 = 0;
    }
    pFVar1 = pIVar16->m_func;
    if (pOVar18->isDeleted == true) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar13 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x14,"(!isDeleted)","Using deleted operand");
      if (!bVar4) goto LAB_00554fc6;
      *puVar13 = 0;
    }
    bVar6 = pOVar18->field_0xb;
    if ((bVar6 & 2) != 0) {
      pOVar18 = IR::Opnd::Copy(pOVar18,pFVar1);
      bVar6 = pOVar18->field_0xb;
    }
    pOVar18->field_0xb = bVar6 | 2;
    pIVar16->m_src2 = pOVar18;
    pIVar16 = GetDefInstr(local_48);
    if (pIVar16 != local_38) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar13 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                         ,0xd16,"(GetDefInstr(orgLinkOpnd) == functionInstr)",
                         "GetDefInstr(orgLinkOpnd) == functionInstr");
      if (!bVar4) goto LAB_00554fc6;
      *puVar13 = 0;
    }
  }
  return pIStack_50;
}

Assistant:

IR::Instr*
Inline::InlineCall(IR::Instr *callInstr, const FunctionJITTimeInfo *funcInfo, const FunctionJITTimeInfo * inlinerData, const StackSym *symCallerThis, bool* pIsInlined, uint callSiteId, uint recursiveInlineDepth, bool isCallInstanceFunction)
{
    IR::Instr* instrNext = callInstr->m_next;
    Func *func = callInstr->m_func;
    Js::BuiltinFunction builtInId = Js::JavascriptLibrary::GetBuiltInForFuncInfo(funcInfo->GetLocalFunctionId());

    *pIsInlined = false;
    if (PHASE_OFF(Js::InlineCallPhase, this->topFunc) || PHASE_OFF(Js::InlineCallPhase, func)
        || !this->topFunc->GetJITFunctionBody()->GetInParamsCount())
    {
        return instrNext;
    }

    // Convert all the current ARG_OUT to  ArgOut_A_InlineBuiltIn
    IR::Opnd *linkOpnd = callInstr->GetSrc2();

    if (!GetDefInstr(linkOpnd)->GetSrc2()->IsSymOpnd())
    {
        // There is no benefit of inlining.call() with no arguments.
        return instrNext;
    }

    *pIsInlined = true;
    const FunctionJITTimeInfo * inlineeData = nullptr;

    IR::Instr * returnInstr = nullptr;
    if (!PHASE_OFF(Js::InlineCallTargetPhase, this->topFunc))
    {
        if (InlineCallTarget(callInstr, inlinerData, &inlineeData, funcInfo, symCallerThis, &returnInstr, recursiveInlineDepth, isCallInstanceFunction))
        {
            Assert(returnInstr);
            return returnInstr;
        }
    }

#if defined(ENABLE_DEBUG_CONFIG_OPTIONS)
    TraceInlining(inlinerData, Js::JavascriptLibrary::GetNameForBuiltIn(builtInId),
        nullptr, 0, this->topFunc->GetWorkItem()->GetJITTimeInfo(), 0, nullptr, callSiteId, callInstr->m_func->GetTopFunc()->IsLoopBody(), builtInId);
#endif

    uint actualCount = 0;
    Assert(linkOpnd->IsSymOpnd());

    // We are trying to optimize this.superConstructor.call(this, a, b,c);
    // argImplicitInstr represents this.superConstructor which we need to call directly.
    IR::Instr * argImplicitThisInstr = nullptr;
    IR::Instr * argSecond = nullptr;
    IR::Instr * dummyInstr = nullptr;
    this->GetArgInstrsForCallAndApply(callInstr, &argImplicitThisInstr, &argSecond, &dummyInstr, actualCount);

    IR::Instr * functionInstr = isCallInstanceFunction ? argSecond : argImplicitThisInstr;
    Assert(functionInstr);

    IR::SymOpnd* orgLinkOpnd = callInstr->GetSrc2()->AsSymOpnd();

    EmitFixedMethodOrFunctionObjectChecksForBuiltIns(callInstr, callInstr, funcInfo, false /*isPolymorphic*/, true /*isBuiltIn*/, false /*isCtor*/, true /*isInlined*/);

    IR::Instr *instr = InsertInlineeBuiltInStartEndTags(callInstr, actualCount);
    instr->m_opcode = Js::OpCode::InlineNonTrackingBuiltInEnd;

    uint actualCountToInlinedCall = actualCount - (isCallInstanceFunction ? 2 : 1);

    IR::Instr *startCall = IR::Instr::New(Js::OpCode::StartCall, func);
    startCall->SetDst(IR::RegOpnd::New(TyVar, func));
    startCall->SetSrc1(IR::IntConstOpnd::New(actualCountToInlinedCall, TyInt32, func)); // New call will have one less parameter.

    callInstr->InsertBefore(startCall);

    callInstr->ReplaceSrc1(functionInstr->GetSrc1());
    callInstr->UnlinkSrc2();
    callInstr->m_opcode = Js::OpCode::CallI;

    IR::Instr* insertBeforeInstr = callInstr;
    IR::Instr* clonedArgout = nullptr;
    IR::Instr* orgArgout = nullptr;

    for (uint i = actualCountToInlinedCall ; i > 0; i--)
    {
        orgArgout = GetDefInstr(orgLinkOpnd);
        orgLinkOpnd = orgArgout->GetSrc2()->AsSymOpnd();
        IR::Opnd *orgSrc1 = orgArgout->GetSrc1();

        // Change ArgOut to use temp as src1.
        StackSym * stackSym = StackSym::New(orgSrc1->GetStackSym()->GetType(), functionInstr->m_func);
        IR::Opnd* tempDst = IR::RegOpnd::New(stackSym, orgSrc1->GetType(), functionInstr->m_func);
        IR::Instr *assignInstr = IR::Instr::New(Func::GetLoadOpForType(orgSrc1->GetType()), tempDst, orgSrc1, functionInstr->m_func);
        assignInstr->SetByteCodeOffset(orgArgout);
        tempDst->SetIsJITOptimizedReg(true);
        orgArgout->InsertBefore(assignInstr);

        StackSym *symDst = callInstr->m_func->m_symTable->GetArgSlotSym((uint16)(i));
        IR::SymOpnd* newLinkOpnd = IR::SymOpnd::New(symDst, 0, TyVar, func);

        clonedArgout = IR::Instr::New(Js::OpCode::ArgOut_A, newLinkOpnd, tempDst, func);
        insertBeforeInstr->SetSrc2(newLinkOpnd);

        insertBeforeInstr->InsertBefore(clonedArgout);
        insertBeforeInstr = clonedArgout;
    }
    clonedArgout->SetSrc2(startCall->GetDst());
    Assert(GetDefInstr(orgLinkOpnd) == functionInstr);
    return instrNext;
}